

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall wallet::LegacyScriptPubKeyMan::SetHDSeed(LegacyScriptPubKeyMan *this,CPubKey *seed)

{
  long lVar1;
  long *plVar2;
  undefined1 uVar3;
  WalletDatabase *database;
  char *in_RSI;
  AnnotatedMixin<std::recursive_mutex> *in_RDI;
  long in_FS_OFFSET;
  WalletBatch batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock40;
  CHDChain newHdChain;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff6b;
  int in_stack_ffffffffffffff6c;
  CPubKey *in_stack_ffffffffffffff70;
  AnnotatedMixin<std::recursive_mutex> *mutexIn;
  CHDChain *in_stack_ffffffffffffff88;
  LegacyScriptPubKeyMan *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mutexIn = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff88,mutexIn,
             in_RSI,(char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
             (bool)in_stack_ffffffffffffff6b);
  CHDChain::CHDChain((CHDChain *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  plVar2 = *(long **)((long)&(in_RDI->super_recursive_mutex).super___recursive_mutex_base._M_mutex +
                     8);
  uVar3 = (**(code **)(*plVar2 + 0x30))(plVar2,0x2227c);
  CPubKey::GetID(in_stack_ffffffffffffff70);
  AddHDChain(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()((signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
                *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  database = (WalletDatabase *)
             (**(code **)(**(long **)((long)&(in_RDI->super_recursive_mutex).
                                             super___recursive_mutex_base._M_mutex + 8) + 0x18))();
  WalletBatch::WalletBatch
            ((WalletBatch *)CONCAT17(uVar3,in_stack_ffffffffffffff58),database,
             (bool)in_stack_ffffffffffffff4f);
  plVar2 = *(long **)((long)&(in_RDI->super_recursive_mutex).super___recursive_mutex_base._M_mutex +
                     8);
  (**(code **)(*plVar2 + 0x28))(plVar2,&stack0xffffffffffffff88);
  WalletBatch::~WalletBatch
            ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::SetHDSeed(const CPubKey& seed)
{
    LOCK(cs_KeyStore);
    // store the keyid (hash160) together with
    // the child index counter in the database
    // as a hdchain object
    CHDChain newHdChain;
    newHdChain.nVersion = m_storage.CanSupportFeature(FEATURE_HD_SPLIT) ? CHDChain::VERSION_HD_CHAIN_SPLIT : CHDChain::VERSION_HD_BASE;
    newHdChain.seed_id = seed.GetID();
    AddHDChain(newHdChain);
    NotifyCanGetAddressesChanged();
    WalletBatch batch(m_storage.GetDatabase());
    m_storage.UnsetBlankWalletFlag(batch);
}